

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::insertSpirvExecutionMode
          (TIntermediate *this,int executionMode,TIntermAggregate *args)

{
  bool bVar1;
  int iVar2;
  TSpirvExecutionMode *this_00;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_01;
  reference ppTVar3;
  undefined4 extraout_var;
  mapped_type *this_02;
  undefined4 in_register_00000034;
  value_type local_68;
  TIntermConstantUnion *extraOperand;
  TIntermNode *arg;
  const_iterator __end2;
  const_iterator __begin2;
  TIntermSequence *__range2;
  TVector<const_glslang::TIntermConstantUnion_*> extraOperands;
  TIntermAggregate *args_local;
  TIntermediate *pTStack_10;
  int executionMode_local;
  TIntermediate *this_local;
  
  extraOperands.
  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  .
  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)args;
  args_local._4_4_ = executionMode;
  pTStack_10 = this;
  if (this->spirvExecutionMode == (TSpirvExecutionMode *)0x0) {
    this_00 = (TSpirvExecutionMode *)
              TSpirvExecutionMode::operator_new
                        ((TSpirvExecutionMode *)0x70,CONCAT44(in_register_00000034,executionMode));
    TSpirvExecutionMode::TSpirvExecutionMode(this_00);
    this->spirvExecutionMode = this_00;
  }
  TVector<const_glslang::TIntermConstantUnion_*>::TVector
            ((TVector<const_glslang::TIntermConstantUnion_*> *)&__range2);
  if (extraOperands.
      super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
      .
      super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    this_01 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
              (**(code **)&(*extraOperands.
                             super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                             .
                             super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)[1].literal)();
    __end2 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin(this_01);
    arg = (TIntermNode *)
          std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                       *)&arg), bVar1) {
      ppTVar3 = __gnu_cxx::
                __normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                ::operator*(&__end2);
      extraOperand = (TIntermConstantUnion *)*ppTVar3;
      iVar2 = (*(extraOperand->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[5])();
      local_68 = (value_type)CONCAT44(extraout_var,iVar2);
      if (local_68 == (value_type)0x0) {
        __assert_fail("extraOperand != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                      ,0x7f,
                      "void glslang::TIntermediate::insertSpirvExecutionMode(int, const TIntermAggregate *)"
                     );
      }
      std::
      vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
      ::push_back((vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                   *)&__range2,&local_68);
      __gnu_cxx::
      __normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
      ::operator++(&__end2);
    }
  }
  this_02 = std::
            map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
            ::operator[]((map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                          *)this->spirvExecutionMode,(key_type_conflict1 *)((long)&args_local + 4));
  TVector<const_glslang::TIntermConstantUnion_*>::operator=
            (this_02,(TVector<const_glslang::TIntermConstantUnion_*> *)&__range2);
  TVector<const_glslang::TIntermConstantUnion_*>::~TVector
            ((TVector<const_glslang::TIntermConstantUnion_*> *)&__range2);
  return;
}

Assistant:

void TIntermediate::insertSpirvExecutionMode(int executionMode, const TIntermAggregate* args)
{
    if (!spirvExecutionMode)
        spirvExecutionMode = new TSpirvExecutionMode;

    TVector<const TIntermConstantUnion*> extraOperands;
    if (args) {
        for (auto arg : args->getSequence()) {
            auto extraOperand = arg->getAsConstantUnion();
            assert(extraOperand != nullptr);
            extraOperands.push_back(extraOperand);
        }
    }
    spirvExecutionMode->modes[executionMode] = extraOperands;
}